

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validateDFD(ValidationContext *this)

{
  long lVar1;
  bool bVar2;
  pointer puVar3;
  uint *puVar4;
  ValidationContext *this_00;
  uint *puVar5;
  SampleType *__dest;
  long *in_RDI;
  vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> samples;
  uint numSamplesValidating;
  uint numSamplesStored;
  BDFD block;
  DFDHeader blockHeader;
  size_t remainingDFDBytes;
  bool foundBDFD;
  uint32_t numBlocks;
  uint32_t dfdTotalSize;
  uchar *ptrDFDIt;
  uchar *ptrDFDEnd;
  uchar *ptrDFD;
  __array buffer;
  ktx_uint32_t dfdByteLength;
  ktx_uint32_t dfdByteOffset;
  unsigned_long *in_stack_00000220;
  vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *in_stack_00000ad8;
  BDFD *in_stack_00000ae0;
  uint32_t *in_stack_00000ae8;
  uint32_t in_stack_00000af4;
  ValidationContext *in_stack_00000af8;
  bool *in_stack_fffffffffffffe68;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  uint local_118;
  uint local_114;
  string local_110 [16];
  uint *in_stack_ffffffffffffff00;
  unsigned_long *in_stack_ffffffffffffff08;
  khr_df_khr_descriptortype_e in_stack_ffffffffffffff10;
  khr_df_vendorid_e in_stack_ffffffffffffff14;
  ValidationContext *in_stack_ffffffffffffff18;
  IssueError *in_stack_ffffffffffffff20;
  ValidationContext *in_stack_ffffffffffffff28;
  long local_b0;
  int local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined8 local_98;
  size_t local_90;
  char *local_88;
  uint local_80;
  undefined1 local_79;
  uint in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  ushort uVar6;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ValidationContext *issue;
  undefined8 local_28;
  undefined8 local_20;
  
  lVar1 = in_RDI[0xd];
  uVar8 = *(uint *)((long)in_RDI + 0x6c);
  if (((int)lVar1 != 0) && (uVar8 != 0)) {
    std::make_unique<unsigned_char[]>((size_t)in_stack_fffffffffffffe88);
    puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (in_stack_fffffffffffffe70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    (**(code **)(*in_RDI + 0x10))(in_RDI,(int)lVar1,puVar3,uVar8,local_28,local_20);
    puVar4 = (uint *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                               (in_stack_fffffffffffffe70);
    this_00 = (ValidationContext *)((long)puVar4 + (ulong)uVar8);
    uVar9 = *puVar4;
    issue = (ValidationContext *)(puVar4 + 1);
    if (uVar8 != uVar9) {
      error<unsigned_int_const&,unsigned_int&>
                (in_stack_ffffffffffffff18,
                 (IssueError *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (uint *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    }
    uVar8 = 0;
    bVar7 = 0;
    for (; issue < this_00;
        issue = (ValidationContext *)((issue->header).identifier + ((ulong)*puVar4 - 0x38))) {
      puVar4 = (uint *)((long)this_00 - (long)issue);
      uVar8 = uVar8 + 1;
      if (10 < uVar8) {
        warning<unsigned_int&,unsigned_long_const&>
                  ((ValidationContext *)CONCAT44(uVar9,uVar8),
                   (IssueWarning *)CONCAT17(bVar7,in_stack_ffffffffffffffa0),puVar4,
                   (unsigned_long *)in_stack_ffffffffffffff90);
        break;
      }
      memset(&stack0xffffffffffffff90,0,8);
      if (puVar4 < (uint *)0x8) {
        error<unsigned_long_const&>
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   (unsigned_long *)in_stack_ffffffffffffff18);
        break;
      }
      in_stack_ffffffffffffff90 =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            &issue->_vptr_ValidationContext;
      uVar6 = (ushort)((ulong)in_stack_ffffffffffffff90 >> 0x30);
      if ((ulong)in_stack_ffffffffffffff90 >> 0x30 < 8) {
        in_stack_ffffffffffffff8c = (uint)uVar6;
        error<unsigned_int&,int>
                  (in_stack_ffffffffffffff18,
                   (IssueError *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (uint *)in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
      }
      else if (puVar4 < (uint *)((ulong)in_stack_ffffffffffffff90 >> 0x30)) {
        in_stack_ffffffffffffff88 = (uint)uVar6;
        error<unsigned_int&,int,unsigned_long_const&>
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   (uint *)in_stack_ffffffffffffff18,
                   (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
      }
      else if ((((ulong)in_stack_ffffffffffffff90 & 0x1ffff) == 0) &&
              (((ulong)in_stack_ffffffffffffff90 >> 0x11 & 0x7fff) == 0)) {
        local_79 = 1;
        bVar2 = std::exchange<bool,bool>
                          ((bool *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        if (bVar2) {
          warning<unsigned_int&>(this_00,(IssueWarning *)issue,(uint *)CONCAT44(uVar9,uVar8));
        }
        else if ((ulong)in_stack_ffffffffffffff90 >> 0x30 < 0x18) {
          local_80 = (uint)(ushort)((ulong)in_stack_ffffffffffffff90 >> 0x30);
          error<unsigned_int&,int>
                    (in_stack_ffffffffffffff18,
                     (IssueError *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (uint *)in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
        }
        else if (uVar8 == 1) {
          memset(&local_98,0,0x18);
          local_98._0_1_ = *(IssueType *)&issue->_vptr_ValidationContext;
          local_98._1_1_ = *(undefined1 *)((long)&issue->_vptr_ValidationContext + 1);
          local_98._2_2_ = *(IssueID *)((long)&issue->_vptr_ValidationContext + 2);
          local_98._4_4_ = *(undefined4 *)((long)&issue->_vptr_ValidationContext + 4);
          local_90 = *(size_t *)&(issue->callback).super__Function_base._M_functor;
          local_88 = *(char **)((long)&(issue->callback).super__Function_base._M_functor + 8);
          uVar6 = (ushort)((uint)local_98._4_4_ >> 0x10);
          if ((int)(uVar6 - 0x18) % 0x10 != 0) {
            local_9c = (uint)uVar6;
            error<unsigned_int&,int>
                      (in_stack_ffffffffffffff18,
                       (IssueError *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (uint *)in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
          }
          local_a0 = local_98._6_2_ - 0x18 >> 4;
          puVar5 = std::min<unsigned_int>(&MAX_NUM_BDFD_SAMPLES,&local_a0);
          local_a4 = *puVar5;
          if (0x10 < local_a0) {
            local_a8 = local_a0 - local_a4;
            local_b0 = ((local_98 >> 0x30) - 0x18) + (ulong)local_a4 * -0x10;
            in_stack_fffffffffffffe68 = (bool *)&local_b0;
            warning<unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_int,unsigned_long>
                      (this_00,(IssueWarning *)issue,(uint *)CONCAT44(uVar9,uVar8),
                       (uint *)CONCAT17(bVar7,in_stack_ffffffffffffffa0),puVar4,
                       (uint *)in_stack_ffffffffffffff90,in_stack_00000220);
          }
          std::allocator<ktx::SampleType>::allocator((allocator<ktx::SampleType> *)0x2b2a88);
          std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::vector
                    ((vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (size_type)in_stack_fffffffffffffe88,
                     (allocator_type *)in_stack_fffffffffffffe80);
          std::allocator<ktx::SampleType>::~allocator((allocator<ktx::SampleType> *)0x2b2aae);
          __dest = std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::data
                             ((vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)0x2b2ac0)
          ;
          in_stack_fffffffffffffe94 = uVar8;
          memcpy(__dest,&(issue->callback).super__Function_base._M_manager,(ulong)local_a4 << 4);
          uVar8 = in_stack_fffffffffffffe94;
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                    (in_stack_fffffffffffffe70);
          validateDFDBasic(in_stack_00000af8,in_stack_00000af4,in_stack_00000ae8,in_stack_00000ae0,
                           in_stack_00000ad8);
          std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::~vector
                    ((vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)
                     in_stack_fffffffffffffe80);
        }
        else {
          bVar7 = 0;
        }
      }
      else if (((((ulong)in_stack_ffffffffffffff90 & 0x1ffff) != 0) ||
               (((uint)((ulong)in_stack_ffffffffffffff90 >> 0x11) & 0x7fff) != 0x6002)) &&
              ((((ulong)in_stack_ffffffffffffff90 & 0x1ffff) != 0 ||
               (((uint)((ulong)in_stack_ffffffffffffff90 >> 0x11) & 0x7fff) != 0x6001)))) {
        in_stack_fffffffffffffe80 =
             (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff10;
        toString_abi_cxx11_((khr_df_vendorid_e)((ulong)puVar3 >> 0x20));
        in_stack_fffffffffffffe88 = local_110;
        toString_abi_cxx11_(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
        warning<unsigned_int&,std::__cxx11::string,std::__cxx11::string>
                  ((ValidationContext *)CONCAT44(uVar9,uVar8),
                   (IssueWarning *)CONCAT17(bVar7,in_stack_ffffffffffffffa0),puVar4,
                   in_stack_ffffffffffffff90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      }
      local_114 = (uint)(ushort)((ulong)in_stack_ffffffffffffff90 >> 0x30);
      local_118 = 8;
      puVar4 = std::max<unsigned_int>(&local_114,&local_118);
    }
    if ((bVar7 & 1) == 0) {
      error<>(in_stack_ffffffffffffff18,
              (IssueError *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              (in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void ValidationContext::validateDFD() {
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;

    if (dfdByteOffset == 0 || dfdByteLength == 0)
        return; // There is no DFD block

    const auto buffer = std::make_unique<uint8_t[]>(dfdByteLength);
    read(dfdByteOffset, buffer.get(), dfdByteLength, "the DFD");
    const auto* ptrDFD = buffer.get();
    const auto* ptrDFDEnd = ptrDFD + dfdByteLength;
    const auto* ptrDFDIt = ptrDFD;

    uint32_t dfdTotalSize;
    std::memcpy(&dfdTotalSize, ptrDFDIt, sizeof(uint32_t));
    ptrDFDIt += sizeof(uint32_t);

    if (dfdByteLength != dfdTotalSize)
        error(DFD::SizeMismatch, dfdByteLength, dfdTotalSize);

    uint32_t numBlocks = 0;
    bool foundBDFD = false;

    while (ptrDFDIt < ptrDFDEnd) {
        const auto remainingDFDBytes = static_cast<std::size_t>(ptrDFDEnd - ptrDFDIt);

        if (++numBlocks > MAX_NUM_DFD_BLOCKS) {
            warning(DFD::TooManyDFDBlocks, numBlocks, remainingDFDBytes);
            break;
        }

        DFDHeader blockHeader{};
        if (remainingDFDBytes < sizeof(DFDHeader)) {
            error(DFD::NotEnoughDataForBlockHeader, remainingDFDBytes);
            break;
        }

        std::memcpy(&blockHeader, ptrDFDIt, sizeof(DFDHeader));

        if (blockHeader.descriptorBlockSize < sizeof(DFDHeader)) {
            error(DFD::DescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

        } else if (blockHeader.descriptorBlockSize > remainingDFDBytes) {
            error(DFD::DescriptorBlockSizeTooBig, numBlocks, +blockHeader.descriptorBlockSize, remainingDFDBytes);

        } else {
            if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT) {
                if (std::exchange(foundBDFD, true)) {
                    warning(DFD::MultipleBDFD, numBlocks);

                } else if (blockHeader.descriptorBlockSize < sizeof(BDFD)) {
                    error(DFD::BasicDescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

                } else if (numBlocks != 1) {
                    // The Basic DFD block has to be the first block.
                    foundBDFD = false;

                } else {
                    BDFD block{};
                    std::memcpy(&block, ptrDFDIt, sizeof(BDFD));

                    if ((block.descriptorBlockSize - 24) % 16 != 0)
                         error(DFD::BasicDescriptorBlockSizeInvalid, numBlocks, +block.descriptorBlockSize);

                    const auto numSamplesStored = (block.descriptorBlockSize - 24u) / 16u;
                    const auto numSamplesValidating = std::min(MAX_NUM_BDFD_SAMPLES, numSamplesStored);

                    if (numSamplesStored > MAX_NUM_BDFD_SAMPLES)
                        warning(DFD::TooManySamples, numBlocks, numSamplesStored, MAX_NUM_BDFD_SAMPLES,
                                numSamplesStored - numSamplesValidating,
                                block.descriptorBlockSize - sizeof(BDFD) - numSamplesValidating * sizeof(SampleType));

                    // Samples are located at the end of the block
                    std::vector<SampleType> samples(numSamplesValidating);
                    std::memcpy(samples.data(), ptrDFDIt + sizeof(BDFD), numSamplesValidating * sizeof(SampleType));

                    validateDFDBasic(numBlocks, reinterpret_cast<uint32_t*>(buffer.get()), block, samples);
                }

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS) {
                // TODO: Implement DFD validation for ADDITIONAL_DIMENSIONS

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES) {
                // TODO: Implement DFD validation for ADDITIONAL_PLANES

            } else {
                warning(DFD::UnknownDFDBlock,
                        numBlocks,
                        toString(khr_df_vendorid_e(blockHeader.vendorId)),
                        toString(khr_df_vendorid_e(blockHeader.vendorId), khr_df_khr_descriptortype_e(blockHeader.descriptorType)));
            }
        }

        ptrDFDIt += std::max(blockHeader.descriptorBlockSize, 8u);
    }

    if (!foundBDFD)
        error(DFD::MissingBDFD);
}